

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  int iVar15;
  float *pfVar16;
  float fVar17;
  
  uVar1 = a->c;
  iVar12 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar15 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar1; uVar11 = uVar11 + 1) {
      pvVar2 = a->data;
      sVar3 = a->elemsize;
      sVar4 = a->cstep;
      pfVar16 = (float *)(sVar4 * uVar11 * sVar3 + (long)pvVar2);
      pvVar5 = c->data;
      sVar6 = c->elemsize;
      sVar7 = c->cstep;
      pfVar14 = (float *)(sVar7 * uVar11 * sVar6 + (long)pvVar5);
      fVar17 = 1.0 / *b->data;
      lVar13 = 0;
      for (iVar15 = 0; iVar15 + 3 < iVar12; iVar15 = iVar15 + 4) {
        fVar8 = pfVar16[1];
        fVar9 = pfVar16[2];
        fVar10 = pfVar16[3];
        *pfVar14 = *pfVar16 * fVar17;
        pfVar14[1] = fVar8 * fVar17;
        pfVar14[2] = fVar9 * fVar17;
        pfVar14[3] = fVar10 * fVar17;
        pfVar16 = pfVar16 + 4;
        pfVar14 = pfVar14 + 4;
        lVar13 = lVar13 + 4;
      }
      for (; (int)lVar13 < iVar12; lVar13 = lVar13 + 1) {
        *(float *)((long)pvVar5 + lVar13 * 4 + sVar7 * sVar6 * uVar11) =
             *(float *)((long)pvVar2 + lVar13 * 4 + sVar4 * sVar3 * uVar11) * fVar17;
      }
    }
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}